

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::SchemaGrammar::getElemId
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *param_3,uint scope)

{
  SchemaElementDecl *local_40;
  SchemaElementDecl *decl;
  uint scope_local;
  XMLCh *param_3_local;
  XMLCh *baseName_local;
  uint uriId_local;
  SchemaGrammar *this_local;
  
  local_40 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::getByKey
                       (this->fElemDeclPool,baseName,uriId,scope);
  if ((local_40 == (SchemaElementDecl *)0x0) &&
     (local_40 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                 getByKey(this->fGroupElemDeclPool,baseName,uriId,scope),
     local_40 == (SchemaElementDecl *)0x0)) {
    this_local = (SchemaGrammar *)0xfffffffe;
  }
  else {
    this_local = (SchemaGrammar *)XMLElementDecl::getId(&local_40->super_XMLElementDecl);
  }
  return (XMLSize_t)this_local;
}

Assistant:

inline XMLSize_t SchemaGrammar::getElemId (const   unsigned int  uriId
                                              , const XMLCh* const    baseName
                                              , const XMLCh* const
                                              , unsigned int          scope ) const
{
    //
    //  In this case, we don't return zero to mean 'not found', so we have to
    //  map it to the official not found value if we don't find it.
    //
    const SchemaElementDecl* decl = fElemDeclPool->getByKey(baseName, uriId, scope);
    if (!decl) {

        decl = fGroupElemDeclPool->getByKey(baseName, uriId, scope);

        if (!decl)
            return XMLElementDecl::fgInvalidElemId;
    }
    return decl->getId();
}